

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_rerolled_array_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,string *base_expr,SPIRType *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char cVar3;
  uint32_t uVar4;
  SPIRType *type_00;
  uint uVar5;
  ulong uVar6;
  char (*in_R9) [2];
  uint __val;
  string __str;
  string subexpr;
  string local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  CompilerGLSL *local_60;
  string *local_58;
  string local_50;
  
  local_58 = base_expr;
  uVar4 = to_array_size_literal
                    (this,type,(int)(type->array).super_VectorView<unsigned_int>.buffer_size - 1);
  local_60 = this;
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                       (type->parent_type).id);
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{ ","");
  if (uVar4 != 0) {
    paVar1 = &local_88.field_2;
    __val = 0;
    do {
      cVar3 = '\x01';
      if (9 < __val) {
        uVar6 = (ulong)__val;
        cVar2 = '\x04';
        do {
          cVar3 = cVar2;
          uVar5 = (uint)uVar6;
          if (uVar5 < 100) {
            cVar3 = cVar3 + -2;
            goto LAB_001bfbc6;
          }
          if (uVar5 < 1000) {
            cVar3 = cVar3 + -1;
            goto LAB_001bfbc6;
          }
          if (uVar5 < 10000) goto LAB_001bfbc6;
          uVar6 = uVar6 / 10000;
          cVar2 = cVar3 + '\x04';
        } while (99999 < uVar5);
        cVar3 = cVar3 + '\x01';
      }
LAB_001bfbc6:
      local_88._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&local_88,cVar3);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (local_88._M_dataplus._M_p,(uint)local_88._M_string_length,__val);
      join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (&local_50,(spirv_cross *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f570e,
                 (char (*) [2])&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2e790f,in_R9
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p);
      }
      if ((type_00->array).super_VectorView<unsigned_int>.buffer_size == 0) {
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      }
      else {
        to_rerolled_array_expression(&local_88,local_60,&local_50,type_00);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar1) {
          operator_delete(local_88._M_dataplus._M_p);
        }
      }
      __val = __val + 1;
      if (__val < uVar4) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    } while (__val != uVar4);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_rerolled_array_expression(const string &base_expr, const SPIRType &type)
{
	uint32_t size = to_array_size_literal(type);
	auto &parent = get<SPIRType>(type.parent_type);
	string expr = "{ ";

	for (uint32_t i = 0; i < size; i++)
	{
		auto subexpr = join(base_expr, "[", convert_to_string(i), "]");
		if (parent.array.empty())
			expr += subexpr;
		else
			expr += to_rerolled_array_expression(subexpr, parent);

		if (i + 1 < size)
			expr += ", ";
	}

	expr += " }";
	return expr;
}